

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

RESULT_TYPE __thiscall
duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
          (MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *this,
          INPUT_TYPE *input)

{
  int64_t in_RSI;
  interval_t iVar1;
  RESULT_TYPE RVar2;
  int64_t delta;
  int64_t in_stack_00000020;
  timestamp_t *in_stack_00000028;
  timestamp_t *in_stack_00000030;
  int64_t iVar3;
  
  timestamp_t::operator-(in_stack_00000030,in_stack_00000028);
  TryAbsOperator::Operation<long,long>(in_stack_00000020);
  iVar1 = Interval::FromMicro(in_RSI);
  RVar2.months = iVar1.months;
  RVar2.days = iVar1.days;
  register0x00000010 = iVar1.micros;
  return RVar2;
}

Assistant:

inline RESULT_TYPE operator()(const INPUT_TYPE &input) const {
		const auto delta = input - median;
		return Interval::FromMicro(TryAbsOperator::Operation<int64_t, int64_t>(delta));
	}